

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode DecodeMetaBlockLength(BrotliDecoderStateInternal *s,BrotliBitReader *br)

{
  uint32_t uVar1;
  BrotliRunningMetablockHeaderState BVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint uVar9;
  
  BVar2 = s->substate_metablock_header;
  do {
    switch(BVar2) {
    case BROTLI_STATE_METABLOCK_HEADER_NONE:
      uVar1 = br->bit_pos_;
      if (uVar1 == 0x40) {
        if (br->avail_in == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar8 = br->val_;
        br->val_ = uVar8 >> 8;
        uVar7 = (ulong)*br->next_in << 0x38 | uVar8 >> 8;
        br->val_ = uVar7;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
        uVar1 = 0x38;
      }
      else {
        uVar7 = br->val_;
      }
      br->bit_pos_ = uVar1 + 1;
      uVar8 = 1L << ((byte)uVar1 & 0x3f);
      s->meta_block_remaining_len = 0;
      *(ushort *)&s->field_0x13e8 =
           (ushort)*(undefined4 *)&s->field_0x13e8 & 0xfff8 | (ushort)((uVar7 & uVar8) != 0);
      if ((uVar7 & uVar8) != 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        goto switchD_00102246_caseD_1;
      }
      BVar2 = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      goto LAB_001023e4;
    case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
switchD_00102246_caseD_1:
      uVar8 = (ulong)br->bit_pos_;
      if (br->bit_pos_ == 0x40) {
        if (br->avail_in == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar8 = br->val_;
        br->val_ = uVar8 >> 8;
        uVar7 = (ulong)*br->next_in << 0x38 | uVar8 >> 8;
        br->val_ = uVar7;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
        uVar8 = 0x38;
      }
      else {
        uVar7 = br->val_;
      }
      uVar1 = (int)uVar8 + 1;
      br->bit_pos_ = uVar1;
      if ((uVar7 >> (uVar8 & 0x3f) & 1) != 0) goto LAB_00102735;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
      uVar1 = br->bit_pos_;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_SIZE:
      goto switchD_00102246_caseD_3;
    case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
      uVar9 = (uint)*(ushort *)&s->field_0x13e8;
      goto LAB_00102542;
    case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
      uVar8 = (ulong)br->bit_pos_;
      if (br->bit_pos_ == 0x40) {
        if (br->avail_in == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar8 = br->val_;
        br->val_ = uVar8 >> 8;
        uVar4 = (ulong)*br->next_in << 0x38 | uVar8 >> 8;
        br->val_ = uVar4;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
        uVar8 = 0x38;
      }
      else {
        uVar4 = br->val_;
      }
      uVar1 = (int)uVar8 + 1;
      br->bit_pos_ = uVar1;
      if ((uVar4 >> (uVar8 & 0x3f) & 1) != 0) {
        return BROTLI_DECODER_ERROR_FORMAT_RESERVED;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
      goto LAB_001025ec;
    case BROTLI_STATE_METABLOCK_HEADER_BYTES:
      uVar1 = br->bit_pos_;
LAB_001025ec:
      if (uVar1 - 0x3f < 2) {
        if (br->avail_in == 0) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar8 = br->val_;
        br->val_ = uVar8 >> 8;
        uVar8 = (ulong)*br->next_in << 0x38 | uVar8 >> 8;
        br->val_ = uVar8;
        uVar1 = uVar1 - 8;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
      }
      else {
        uVar8 = br->val_;
      }
      uVar8 = uVar8 >> ((byte)uVar1 & 0x3f);
      br->bit_pos_ = uVar1 + 2;
      if ((uVar8 & 3) == 0) goto LAB_00102735;
      uVar9 = *(uint *)&s->field_0x13e8 & 0xfffff00f | ((uint)uVar8 & 3) << 4;
      *(short *)&s->field_0x13e8 = (short)uVar9;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
LAB_00102667:
      uVar5 = s->loop_counter;
      if ((int)(uVar9 >> 4 & 0xff) <= (int)uVar5) {
        uVar6 = s->meta_block_remaining_len;
        goto LAB_0010272b;
      }
      uVar1 = br->bit_pos_;
      iVar3 = uVar5 * 8;
      goto LAB_0010268b;
    case BROTLI_STATE_METABLOCK_HEADER_METADATA:
      uVar9 = (uint)*(ushort *)&s->field_0x13e8;
      goto LAB_00102667;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
    if (uVar1 - 0x3f < 2) {
      if (br->avail_in == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar8 = br->val_;
      br->val_ = uVar8 >> 8;
      uVar7 = (ulong)*br->next_in << 0x38 | uVar8 >> 8;
      br->val_ = uVar7;
      uVar1 = uVar1 - 8;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
    }
    else {
      uVar7 = br->val_;
    }
    uVar5 = (uint)(uVar7 >> ((byte)uVar1 & 0x3f)) & 3;
    br->bit_pos_ = uVar1 + 2;
    iVar3 = uVar5 * 0x10;
    uVar6 = *(uint *)&s->field_0x13e8 & 0xfffff00f;
    uVar9 = iVar3 + uVar6 + 0x40;
    *(short *)&s->field_0x13e8 = (short)uVar9;
    s->loop_counter = 0;
    if (uVar5 != 3) {
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
      uVar5 = 0;
      goto LAB_00102483;
    }
    *(ushort *)&s->field_0x13e8 = (ushort)iVar3 | (ushort)uVar6 | 0x44;
    BVar2 = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
LAB_001023e4:
    s->substate_metablock_header = BVar2;
  } while( true );
  while( true ) {
    uVar8 = uVar7 >> ((byte)uVar1 & 0x3f);
    uVar1 = uVar1 + 8;
    br->bit_pos_ = uVar1;
    uVar5 = uVar5 + 1;
    uVar9 = *(uint *)&s->field_0x13e8 >> 4 & 0xff;
    if (((uVar5 == uVar9) && (1 < (ushort)uVar9)) && ((uVar8 & 0xff) == 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE;
    }
    uVar6 = ((uint)uVar8 & 0xff) << ((byte)iVar3 & 0x1f) | s->meta_block_remaining_len;
    s->meta_block_remaining_len = uVar6;
    iVar3 = iVar3 + 8;
    if ((int)uVar9 <= (int)uVar5) break;
LAB_0010268b:
    if (uVar1 - 0x39 < 8) {
      if (br->avail_in == 0) goto LAB_00102746;
      uVar8 = br->val_;
      br->val_ = uVar8 >> 8;
      uVar7 = (ulong)*br->next_in << 0x38 | uVar8 >> 8;
      br->val_ = uVar7;
      uVar1 = uVar1 - 8;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
    }
    else {
      uVar7 = br->val_;
    }
  }
LAB_0010272b:
  s->meta_block_remaining_len = uVar6 + 1;
  goto LAB_00102735;
switchD_00102246_caseD_3:
  uVar5 = s->loop_counter;
  uVar9 = (uint)*(ushort *)&s->field_0x13e8;
LAB_00102483:
  if ((int)uVar5 < (int)(uVar9 >> 4 & 0xff)) {
    uVar1 = br->bit_pos_;
    iVar3 = uVar5 * 4;
    do {
      if (uVar1 - 0x3d < 4) {
        if (br->avail_in == 0) {
LAB_00102746:
          s->loop_counter = uVar5;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar8 = br->val_;
        br->val_ = uVar8 >> 8;
        uVar7 = (ulong)*br->next_in << 0x38 | uVar8 >> 8;
        br->val_ = uVar7;
        uVar1 = uVar1 - 8;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
      }
      else {
        uVar7 = br->val_;
      }
      uVar8 = uVar7 >> ((byte)uVar1 & 0x3f);
      uVar1 = uVar1 + 4;
      br->bit_pos_ = uVar1;
      uVar5 = uVar5 + 1;
      uVar9 = *(uint *)&s->field_0x13e8;
      uVar6 = uVar9 >> 4 & 0xff;
      if (((uVar5 == uVar6) && (4 < (ushort)uVar6)) && ((uVar8 & 0xf) == 0)) {
        return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
      }
      s->meta_block_remaining_len =
           s->meta_block_remaining_len | ((uint)uVar8 & 0xf) << ((byte)iVar3 & 0x1f);
      iVar3 = iVar3 + 4;
    } while ((int)uVar5 < (int)uVar6);
  }
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
LAB_00102542:
  if ((uVar9 & 1) == 0) {
    uVar8 = (ulong)br->bit_pos_;
    if (br->bit_pos_ == 0x40) {
      if (br->avail_in == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar8 = br->val_;
      br->val_ = uVar8 >> 8;
      uVar4 = (ulong)*br->next_in << 0x38 | uVar8 >> 8;
      br->val_ = uVar4;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
      uVar8 = 0x38;
    }
    else {
      uVar4 = br->val_;
    }
    br->bit_pos_ = (int)uVar8 + 1;
    *(ushort *)&s->field_0x13e8 =
         ((ushort)*(undefined4 *)&s->field_0x13e8 & 0xfffd) +
         (ushort)((uVar4 >> (uVar8 & 0x3f) & 1) != 0) * 2;
  }
  s->meta_block_remaining_len = s->meta_block_remaining_len + 1;
LAB_00102735:
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE DecodeMetaBlockLength(
    BrotliDecoderState* s, BrotliBitReader* br) {
  uint32_t bits;
  int i;
  for (;;) {
    switch (s->substate_metablock_header) {
      case BROTLI_STATE_METABLOCK_HEADER_NONE:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->is_last_metablock = bits ? 1 : 0;
        s->meta_block_remaining_len = 0;
        s->is_uncompressed = 0;
        s->is_metadata = 0;
        if (!s->is_last_metablock) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
          break;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
        if (!BrotliSafeReadBits(br, 2, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->size_nibbles = (uint8_t)(bits + 4);
        s->loop_counter = 0;
        if (bits == 3) {
          s->is_metadata = 1;
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
          break;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_SIZE:
        i = s->loop_counter;
        for (; i < (int)s->size_nibbles; ++i) {
          if (!BrotliSafeReadBits(br, 4, &bits)) {
            s->loop_counter = i;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (i + 1 == s->size_nibbles && s->size_nibbles > 4 && bits == 0) {
            return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE);
          }
          s->meta_block_remaining_len |= (int)(bits << (i * 4));
        }
        s->substate_metablock_header =
            BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
        if (!s->is_last_metablock) {
          if (!BrotliSafeReadBits(br, 1, &bits)) {
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          s->is_uncompressed = bits ? 1 : 0;
        }
        ++s->meta_block_remaining_len;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;

      case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits != 0) {
          return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_RESERVED);
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_BYTES:
        if (!BrotliSafeReadBits(br, 2, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits == 0) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        s->size_nibbles = (uint8_t)bits;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_METADATA:
        i = s->loop_counter;
        for (; i < (int)s->size_nibbles; ++i) {
          if (!BrotliSafeReadBits(br, 8, &bits)) {
            s->loop_counter = i;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (i + 1 == s->size_nibbles && s->size_nibbles > 1 && bits == 0) {
            return BROTLI_FAILURE(
                BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE);
          }
          s->meta_block_remaining_len |= (int)(bits << (i * 8));
        }
        ++s->meta_block_remaining_len;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;

      default:
        return
            BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
    }
  }
}